

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<1>_>
::CopyNamesFromValueNodes
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<1>_>
           *this)

{
  ValueNode *this_00;
  const_reference this_01;
  string *psVar1;
  BasicConstraintKeeper *in_RDI;
  size_type i;
  vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *vn;
  NLBaseReif<1> *in_stack_ffffffffffffffb8;
  string local_38 [32];
  size_type local_18;
  vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *local_10;
  
  this_00 = BasicConstraintKeeper::GetValueNode(in_RDI);
  local_10 = pre::ValueNode::GetStrVec(this_00);
  local_18 = std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::size(local_10);
  while (local_18 != 0) {
    local_18 = local_18 - 1;
    std::
    deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<1>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<1>_>::Container>_>
    ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<1>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<1>_>::Container>_>
                  *)in_RDI,(size_type)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8 = Container::GetCon((Container *)0x3c3d59);
    this_01 = std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::operator[]
                        (local_10,local_18);
    psVar1 = pre::VCString::MakeCurrentName_abi_cxx11_(this_01);
    std::__cxx11::string::string(local_38,(string *)psVar1);
    BasicConstraint::SetName((BasicConstraint *)in_RDI,(string *)in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void CopyNamesFromValueNodes() override {
    const auto& vn = GetValueNode().GetStrVec();
    assert(vn.size()==cons_.size());
    for (auto i=vn.size(); i--; )
      cons_[i].GetCon().SetName(vn[i].MakeCurrentName());
  }